

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlEntityPtr xmlParseEntityRef(xmlParserCtxtPtr ctxt)

{
  xmlChar *name;
  xmlEntityPtr pxVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    name = xmlParseEntityRefInternal(ctxt);
    if (name != (xmlChar *)0x0) {
      pxVar1 = xmlLookupGeneralEntity(ctxt,name,0);
      return pxVar1;
    }
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlParseEntityRef(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;

    if (ctxt == NULL)
        return(NULL);

    name = xmlParseEntityRefInternal(ctxt);
    if (name == NULL)
        return(NULL);

    return(xmlLookupGeneralEntity(ctxt, name, /* inAttr */ 0));
}